

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O1

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewEnd(LocationUpdater *this,BinaryLocation oldEnd)

{
  BinaryLocation BVar1;
  Expression *pEVar2;
  Function *pFVar3;
  DelimiterInfo DVar4;
  
  pEVar2 = AddrExprMap::getEnd(&this->oldExprAddrMap,oldEnd);
  if (pEVar2 != (Expression *)0x0) {
    BVar1 = getNewExprEnd(this,oldEnd);
    return BVar1;
  }
  pFVar3 = FuncAddrMap::getEnd(&this->oldFuncAddrMap,oldEnd);
  if (pFVar3 != (Function *)0x0) {
    BVar1 = getNewFuncEnd(this,oldEnd);
    return BVar1;
  }
  DVar4 = AddrExprMap::getDelimiter(&this->oldExprAddrMap,oldEnd);
  if (DVar4.expr != (Expression *)0x0) {
    BVar1 = getNewDelimiter(this,oldEnd);
    return BVar1;
  }
  return 0;
}

Assistant:

BinaryLocation getNewEnd(BinaryLocation oldEnd) const {
    if (hasOldExprEnd(oldEnd)) {
      return getNewExprEnd(oldEnd);
    } else if (hasOldFuncEnd(oldEnd)) {
      return getNewFuncEnd(oldEnd);
    } else if (hasOldDelimiter(oldEnd)) {
      return getNewDelimiter(oldEnd);
    }
    return 0;
  }